

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O1

bool __thiscall csv::CSVField::try_parse_hex(CSVField *this,int *parsedValue)

{
  bool bVar1;
  byte bVar2;
  DataType DVar3;
  int iVar4;
  char decimalSymbol;
  ulong uVar5;
  char *pcVar6;
  char *out;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  
  uVar5 = (this->sv)._M_len;
  if (uVar5 == 0) {
    uVar8 = 0;
  }
  else {
    uVar7 = 0;
    do {
      uVar8 = uVar7;
      if ((this->sv)._M_str[uVar7] != ' ') break;
      uVar7 = uVar7 + 1;
      uVar8 = uVar5;
    } while (uVar5 != uVar7);
  }
  uVar7 = uVar8;
  if (uVar8 < uVar5) {
    uVar9 = uVar8;
    do {
      uVar7 = uVar9;
      if ((this->sv)._M_str[uVar9] == ' ') break;
      uVar9 = uVar9 + 1;
      uVar7 = uVar5;
    } while (uVar5 != uVar9);
  }
  uVar7 = uVar7 - uVar8;
  if (uVar7 == 0) {
    return false;
  }
  if (uVar8 <= uVar5) {
    uVar9 = uVar5 - uVar8;
    if (uVar7 <= uVar5 - uVar8) {
      uVar9 = uVar7;
    }
    bVar11 = uVar9 == 0;
    if (bVar11) {
      iVar4 = 0;
    }
    else {
      pcVar6 = (this->sv)._M_str;
      lVar10 = uVar7 - 1;
      uVar5 = 0;
      iVar4 = 0;
      do {
        bVar2 = pcVar6[uVar5 + uVar8] - 0x30;
        if ((bVar2 < 0x37) && ((0x7e0000007e03ffU >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          auVar13._8_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar13._0_8_ = lVar10;
          auVar13._12_4_ = 0x45300000;
          dVar12 = exp2(((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) * 4.0);
          iVar4 = iVar4 + (int)dVar12 * *(int *)(&DAT_0010d624 + (ulong)bVar2 * 4);
          lVar10 = lVar10 + -1;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (!bVar1) break;
        uVar5 = uVar5 + 1;
        bVar11 = uVar9 == uVar5;
      } while (!bVar11);
    }
    if (!bVar11) {
      return false;
    }
    *parsedValue = iVar4;
    return true;
  }
  out = "%s: __pos (which is %zu) > __size (which is %zu)";
  pcVar6 = "basic_string_view::substr";
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar8);
  switch(*(undefined4 *)((long)out + 0x20)) {
  case 0:
    goto switchD_0010a23e_caseD_0;
  case 0xffffffff:
  case 1:
  case 7:
    DVar3 = internals::data_type(*(string_view *)((long)out + 0x10),(longdouble *)out,decimalSymbol)
    ;
    *(DataType *)((long)out + 0x20) = DVar3;
  }
  if (*(int *)((long)out + 0x20) - 2U < 6) {
    *(longdouble *)pcVar6 = *(longdouble *)out;
    bVar11 = true;
  }
  else {
switchD_0010a23e_caseD_0:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

CSV_INLINE bool CSVField::try_parse_hex(int& parsedValue) {
        size_t start = 0, end = 0;

        // Trim out whitespace chars
        for (; start < this->sv.size() && this->sv[start] == ' '; start++);
        for (end = start; end < this->sv.size() && this->sv[end] != ' '; end++);
        
        int value_ = 0;

        size_t digits = (end - start);
        size_t base16_exponent = digits - 1;

        if (digits == 0) return false;

        for (const auto& ch : this->sv.substr(start, digits)) {
            int digit = 0;

            switch (ch) {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                digit = static_cast<int>(ch - '0');
                break;
            case 'a':
            case 'A':
                digit = 10;
                break;
            case 'b':
            case 'B':
                digit = 11;
                break;
            case 'c':
            case 'C':
                digit = 12;
                break;
            case 'd':
            case 'D':
                digit = 13;
                break;
            case 'e':
            case 'E':
                digit = 14;
                break;
            case 'f':
            case 'F':
                digit = 15;
                break;
            default:
                return false;
            }

            value_ += digit * (int)pow(16, (double)base16_exponent);
            base16_exponent--;
        }

        parsedValue = value_;
        return true;
    }